

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

void __thiscall
Js::Type::ExtractSnapType(Type *this,SnapType *sType,SnapHandler *optHandler,SlabAllocator *alloc)

{
  bool bVar1;
  TypeId TVar2;
  RecyclableObject *pRVar3;
  ScriptContext *pSVar4;
  SlabAllocator *alloc_local;
  SnapHandler *optHandler_local;
  SnapType *sType_local;
  Type *this_local;
  
  sType->TypePtrId = (TTD_PTR_ID)this;
  TVar2 = GetTypeId(this);
  sType->JsTypeId = TVar2;
  pRVar3 = GetPrototype(this);
  sType->PrototypeVar = pRVar3;
  pSVar4 = GetScriptContext(this);
  sType->ScriptContextLogId = pSVar4->ScriptContextLogTag;
  sType->TypeHandlerInfo = optHandler;
  sType->HasNoEnumerableProperties = false;
  bVar1 = DynamicType::Is(this);
  if (bVar1) {
    bVar1 = DynamicType::GetHasNoEnumerableProperties((DynamicType *)this);
    sType->HasNoEnumerableProperties = bVar1;
  }
  return;
}

Assistant:

void Type::ExtractSnapType(TTD::NSSnapType::SnapType* sType, TTD::NSSnapType::SnapHandler* optHandler, TTD::SlabAllocator& alloc) const
    {
        sType->TypePtrId = TTD_CONVERT_TYPEINFO_TO_PTR_ID(this);
        sType->JsTypeId = this->GetTypeId();

        sType->PrototypeVar = this->GetPrototype();

        sType->ScriptContextLogId = this->GetScriptContext()->ScriptContextLogTag;
        sType->TypeHandlerInfo = optHandler;

        sType->HasNoEnumerableProperties = false;
        if(Js::DynamicType::Is(this))
        {
            sType->HasNoEnumerableProperties = static_cast<const Js::DynamicType*>(this)->GetHasNoEnumerableProperties();
        }
    }